

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

JavascriptString *
Js::JavascriptArray::ToLocaleString<Js::RecyclableObject>
          (RecyclableObject *arr,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  TypedArrayBase *pTVar5;
  Var aValue;
  undefined4 *puVar6;
  Type TVar7;
  anon_class_48_6_399da0b0 local_b8;
  anon_class_24_3_633237ca local_88;
  JavascriptArray *local_70;
  RecyclableObject *arr_local;
  JavascriptString *res;
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  bool pushedObject;
  
  res = (JavascriptString *)scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)res)->noJsReentrancy;
  ((ThreadContext *)res)->noJsReentrancy = true;
  local_70 = (JavascriptArray *)arr;
  jsReentLock._24_8_ = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)&res,arr);
  bVar2 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(arr);
  if (bVar2) {
    pTVar5 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(arr);
    if (pTVar5 == (TypedArrayBase *)0x0) goto LAB_00b95277;
    TVar7 = (pTVar5->super_ArrayBufferParent).super_ArrayObject.length;
    scriptContext_local._0_4_ = TVar7;
  }
  else {
LAB_00b95277:
    *(undefined1 *)&res[8].super_RecyclableObject.type.ptr = jsReentLock.m_arrayObject2._0_1_;
    aValue = JavascriptOperators::OP_GetLength(arr,scriptContext);
    if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) goto LAB_00b9532d;
      uVar3 = JavascriptConversion::ToUInt32_Full(aValue,scriptContext);
      aValue = (Var)(ulong)uVar3;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00b95464;
      *puVar6 = 0;
LAB_00b9532d:
      if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) {
LAB_00b95464:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
    }
    TVar7 = (Type)aValue;
    scriptContext_local._0_4_ = TVar7;
    JsReentLock::MutateArrayObject((JsReentLock *)&res);
    *(undefined1 *)&res[8].super_RecyclableObject.type.ptr = 1;
  }
  if (TVar7 != 0) {
    BVar4 = ScriptContext::CheckObject(scriptContext,arr);
    if (BVar4 == 0) {
      arr_local = &JavascriptLibrary::GetEmptyString
                             ((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                   super_RecyclableObject;
      local_b8.res = (JavascriptString **)&arr_local;
      local_b8.pushedObject = (bool *)((long)&scriptContext_local + 7);
      scriptContext_local._7_1_ = 0;
      local_b8.scriptContext = (ScriptContext **)&jsReentLock.m_savedNoJsReentrancy;
      local_b8.arr = (RecyclableObject **)&local_70;
      local_b8.jsReentLock = (JsReentLock *)&res;
      local_b8.length = (uint32 *)&scriptContext_local;
      local_88.pushedObject = local_b8.pushedObject;
      local_88.scriptContext = local_b8.scriptContext;
      local_88.arr = (JavascriptArray **)local_b8.arr;
      TryFinally<Js::JavascriptArray::ToLocaleString<Js::RecyclableObject>(Js::RecyclableObject*,Js::ScriptContext*)::_lambda()_1_,Js::JavascriptArray::ToLocaleString<Js::RecyclableObject>(Js::RecyclableObject*,Js::ScriptContext*)::_lambda(bool)_1_>
                (&local_b8,&local_88);
      if (arr_local == (RecyclableObject *)0x0) {
        arr_local = &JavascriptLibrary::GetEmptyString
                               (*(JavascriptLibrary **)(jsReentLock._24_8_ + 8))->
                     super_RecyclableObject;
      }
      goto LAB_00b953cd;
    }
  }
  arr_local = &JavascriptLibrary::GetEmptyString
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_RecyclableObject;
LAB_00b953cd:
  *(undefined1 *)&res[8].super_RecyclableObject.type.ptr = jsReentLock.m_arrayObject2._0_1_;
  return (JavascriptString *)arr_local;
}

Assistant:

JavascriptString* JavascriptArray::ToLocaleString(T* arr, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint32 length = 0;
        TypedArrayBase * typedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(static_cast<RecyclableObject*>(arr));
        if (typedArray)
        {
            // For a TypedArray use the actual length of the array.
            length = typedArray->GetLength();
        }
        else
        {
            //For anything else, use the "length" property if present.
            JS_REENTRANT(jsReentLock, length = ItemTrace<T>::GetLength(arr, scriptContext));
        }

        if (length == 0 || scriptContext->CheckObject(arr))
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        JavascriptString* res = scriptContext->GetLibrary()->GetEmptyString();
        bool pushedObject = false;

        TryFinally([&]()
        {
            scriptContext->PushObject(arr);
            pushedObject = true;

            Var element;
            JS_REENTRANT(jsReentLock, BOOL gotItem = ItemTrace<T>::GetItem(arr, 0, &element, scriptContext));
            if (gotItem)
            {
                JS_REENTRANT(jsReentLock, res = JavascriptArray::ToLocaleStringHelper(element, scriptContext));
            }

            if (length > 1)
            {
                uint32 sepSize = 0;
                char16 szSeparator[Arrays::SeparatorBufferSize];

                bool hasLocaleSeparator = Arrays::GetLocaleSeparator(szSeparator, &sepSize, Arrays::SeparatorBufferSize);

                JavascriptString* separator = nullptr;

                if (hasLocaleSeparator)
                {
                    separator = JavascriptString::NewCopyBuffer(szSeparator, static_cast<charcount_t>(sepSize), scriptContext);
                }
                else
                {
                    separator = scriptContext->GetLibrary()->GetCommaDisplayString();
                }

                for (uint32 i = 1; i < length; i++)
                {
                    res = JavascriptString::Concat(res, separator);
                    JS_REENTRANT(jsReentLock, gotItem = ItemTrace<T>::GetItem(arr, i, &element, scriptContext));
                    if (gotItem)
                    {
                        JS_REENTRANT(jsReentLock, res = JavascriptString::Concat(res, JavascriptArray::ToLocaleStringHelper(element, scriptContext)));
                    }
                }
            }
        },
        [&](bool/*hasException*/)
        {
            if (pushedObject)
            {
                Var top = scriptContext->PopObject();
                AssertMsg(top == arr, "Unmatched operation stack");
            }
        });

        if (res == nullptr)
        {
            res = scriptContext->GetLibrary()->GetEmptyString();
        }

        return res;
    }